

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O0

void TTD::NSSnapObjects::AssertSnapEquiv_SnapArrayInfoCore<void*>
               (SnapArrayInfoBlock<void_*> *arrayInfo1,SnapArrayInfoBlock<void_*> *arrayInfo2,
               TTDCompareMap *compareMap)

{
  uint32 local_38;
  uint32 local_34;
  uint32 local_30;
  uint32 local_2c;
  uint32 pos2;
  uint32 index2;
  uint32 pos1;
  uint32 index1;
  TTDCompareMap *compareMap_local;
  SnapArrayInfoBlock<void_*> *arrayInfo2_local;
  SnapArrayInfoBlock<void_*> *arrayInfo1_local;
  
  if (arrayInfo1 == (SnapArrayInfoBlock<void_*> *)0x0) {
    local_34 = 0;
  }
  else {
    local_34 = arrayInfo1->FirstIndex;
  }
  index2 = local_34;
  pos2 = 0;
  if (arrayInfo2 == (SnapArrayInfoBlock<void_*> *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = arrayInfo2->FirstIndex;
  }
  local_2c = local_38;
  local_30 = 0;
  _pos1 = compareMap;
  compareMap_local = (TTDCompareMap *)arrayInfo2;
  arrayInfo2_local = arrayInfo1;
  while (arrayInfo2_local != (SnapArrayInfoBlock<void_*> *)0x0 &&
         compareMap_local != (TTDCompareMap *)0x0) {
    if (index2 < local_2c) {
      TTDCompareMap::DiagnosticAssert
                (_pos1,(bool)((arrayInfo2_local->ArrayValidTags[pos2] != '\0' ^ 0xffU) & 1));
      AdvanceArrayIndex_SnapArrayInfoCompare<void*>(&index2,&pos2,&arrayInfo2_local);
    }
    else if (local_2c < index2) {
      TTDCompareMap::DiagnosticAssert
                (_pos1,(bool)((*(char *)((long)&((compareMap_local->H1PtrIdWorklist).list.
                                                 super_DListBase<unsigned_long,_RealCount>.
                                                 super_DListNodeBase<unsigned_long>.prev.base)->next
                                        + (ulong)local_30) != '\0' ^ 0xffU) & 1));
      AdvanceArrayIndex_SnapArrayInfoCompare<void*>
                (&local_2c,&local_30,(SnapArrayInfoBlock<void_*> **)&compareMap_local);
    }
    else {
      TTDCompareMap::DiagnosticAssert
                (_pos1,arrayInfo2_local->ArrayValidTags[pos2] ==
                       *(byte *)((long)&((compareMap_local->H1PtrIdWorklist).list.
                                         super_DListBase<unsigned_long,_RealCount>.
                                         super_DListNodeBase<unsigned_long>.prev.base)->next +
                                (ulong)local_30));
      if (arrayInfo2_local->ArrayValidTags[pos2] != '\0') {
        SnapArrayInfo_EquivValue
                  (arrayInfo2_local->ArrayRangeContents[pos2],
                   (&((compareMap_local->H1PtrIdWorklist).list.
                      super_DListBase<unsigned_long,_RealCount>.super_DListNodeBase<unsigned_long>.
                      next.base)->next)[local_30].base,_pos1,index2);
      }
      AdvanceArrayIndex_SnapArrayInfoCompare<void*>(&index2,&pos2,&arrayInfo2_local);
      AdvanceArrayIndex_SnapArrayInfoCompare<void*>
                (&local_2c,&local_30,(SnapArrayInfoBlock<void_*> **)&compareMap_local);
    }
  }
  while (arrayInfo2_local != (SnapArrayInfoBlock<void_*> *)0x0) {
    TTDCompareMap::DiagnosticAssert
              (_pos1,(bool)((arrayInfo2_local->ArrayValidTags[pos2] != '\0' ^ 0xffU) & 1));
    AdvanceArrayIndex_SnapArrayInfoCompare<void*>(&index2,&pos2,&arrayInfo2_local);
  }
  while (arrayInfo2_local != (SnapArrayInfoBlock<void_*> *)0x0) {
    TTDCompareMap::DiagnosticAssert
              (_pos1,(bool)((*(char *)((long)&((compareMap_local->H1PtrIdWorklist).list.
                                               super_DListBase<unsigned_long,_RealCount>.
                                               super_DListNodeBase<unsigned_long>.prev.base)->next +
                                      (ulong)local_30) != '\0' ^ 0xffU) & 1));
    AdvanceArrayIndex_SnapArrayInfoCompare<void*>
              (&local_2c,&local_30,(SnapArrayInfoBlock<void_*> **)&compareMap_local);
  }
  return;
}

Assistant:

void AssertSnapEquiv_SnapArrayInfoCore(const SnapArrayInfoBlock<T>* arrayInfo1, const SnapArrayInfoBlock<T>* arrayInfo2, TTDCompareMap& compareMap)
        {
            uint32 index1 = (arrayInfo1 != nullptr) ? arrayInfo1->FirstIndex : 0;
            uint32 pos1 = 0;

            uint32 index2 = (arrayInfo2 != nullptr) ? arrayInfo2->FirstIndex : 0;
            uint32 pos2 = 0;

            while(arrayInfo1 != nullptr && arrayInfo2 != nullptr)
            {
                if(index1 < index2)
                {
                    compareMap.DiagnosticAssert(!arrayInfo1->ArrayValidTags[pos1]);
                    AdvanceArrayIndex_SnapArrayInfoCompare(&index1, &pos1, &arrayInfo1);
                }
                else if(index1 > index2)
                {
                    compareMap.DiagnosticAssert(!arrayInfo2->ArrayValidTags[pos2]);
                    AdvanceArrayIndex_SnapArrayInfoCompare(&index2, &pos2, &arrayInfo2);
                }
                else
                {
                    compareMap.DiagnosticAssert(arrayInfo1->ArrayValidTags[pos1] == arrayInfo2->ArrayValidTags[pos2]);
                    if(arrayInfo1->ArrayValidTags[pos1])
                    {
                        SnapArrayInfo_EquivValue(arrayInfo1->ArrayRangeContents[pos1], arrayInfo2->ArrayRangeContents[pos2], compareMap, index1);
                    }

                    AdvanceArrayIndex_SnapArrayInfoCompare(&index1, &pos1, &arrayInfo1);
                    AdvanceArrayIndex_SnapArrayInfoCompare(&index2, &pos2, &arrayInfo2);
                }
            }

            //make sure any remaining entries an empty
            while(arrayInfo1 != nullptr)
            {
                compareMap.DiagnosticAssert(!arrayInfo1->ArrayValidTags[pos1]);
                AdvanceArrayIndex_SnapArrayInfoCompare(&index1, &pos1, &arrayInfo1);
            }

            while(arrayInfo1 != nullptr)
            {
                compareMap.DiagnosticAssert(!arrayInfo2->ArrayValidTags[pos2]);
                AdvanceArrayIndex_SnapArrayInfoCompare(&index2, &pos2, &arrayInfo2);
            }
        }